

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O3

int cvLsInitializeCounters(CVLsMem cvls_mem)

{
  cvls_mem->ncfl = 0;
  cvls_mem->njtsetup = 0;
  cvls_mem->nli = 0;
  cvls_mem->nps = 0;
  cvls_mem->nstlj = 0;
  cvls_mem->npe = 0;
  cvls_mem->nje = 0;
  cvls_mem->nfeDQ = 0;
  cvls_mem->njtimes = 0;
  return 0;
}

Assistant:

int cvLsInitializeCounters(CVLsMem cvls_mem)
{
  cvls_mem->nje      = 0;
  cvls_mem->nfeDQ    = 0;
  cvls_mem->nstlj    = 0;
  cvls_mem->npe      = 0;
  cvls_mem->nli      = 0;
  cvls_mem->nps      = 0;
  cvls_mem->ncfl     = 0;
  cvls_mem->njtsetup = 0;
  cvls_mem->njtimes  = 0;
  return(0);
}